

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void __thiscall Search::predictor::set_input_length(predictor *this,size_t input_length)

{
  example *peVar1;
  vw_exception *this_00;
  string local_1c0;
  stringstream __msg;
  ostream local_190;
  
  this->is_ldf = true;
  if (this->ec_alloced == true) {
    peVar1 = (example *)realloc(this->ec,input_length * 0x68d0);
    if (peVar1 == (example *)0x0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<(&local_190,"realloc failed in search.cc");
      this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this_00,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
                 ,0xc71,&local_1c0);
      __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  else {
    peVar1 = calloc_or_throw<example>(input_length);
  }
  this->ec = peVar1;
  this->ec_cnt = input_length;
  this->ec_alloced = true;
  return;
}

Assistant:

void predictor::set_input_length(size_t input_length)
{
  is_ldf = true;
  if (ec_alloced)
  {
    example* temp = (example*)realloc(ec, input_length * sizeof(example));
    if (temp != nullptr)
      ec = temp;
    else
      THROW("realloc failed in search.cc");
  }
  else
    ec = calloc_or_throw<example>(input_length);
  ec_cnt = input_length;
  ec_alloced = true;
}